

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

BOOL MiscPutenv(char *string,BOOL deleteIfEmpty)

{
  int iVar1;
  CPalThread *pThread;
  char *pcVar2;
  size_t sVar3;
  char *name;
  size_t sVar4;
  char **ppcVar5;
  int iVar6;
  size_t szSize;
  long lVar7;
  BOOL BVar8;
  long lVar9;
  char *__s;
  
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  pcVar2 = strchr(string,0x3d);
  if (pcVar2 == (char *)0x0 || pcVar2 == string) {
    return 0;
  }
  if ((deleteIfEmpty == 0) || (pcVar2[1] != '\0')) {
    name = CorUnix::InternalStrdup(string);
    if (name == (char *)0x0) {
      return 0;
    }
    CorUnix::InternalEnterCriticalSection(pThread,&gcsEnvironment);
    ppcVar5 = palEnvironment;
    __s = *palEnvironment;
    if (__s == (char *)0x0) {
      lVar9 = 0;
      iVar6 = 0;
    }
    else {
      sVar3 = (size_t)((int)pcVar2 - (int)string);
      lVar9 = 0;
      iVar6 = 0;
      do {
        pcVar2 = strchr(__s,0x3d);
        if (pcVar2 == (char *)0x0) {
          sVar4 = strlen(__s);
          pcVar2 = __s + sVar4;
        }
        if (((long)pcVar2 - (long)__s == sVar3) && (iVar1 = memcmp(string,__s,sVar3), iVar1 == 0)) {
          ppcVar5[lVar9] = name;
          if (palEnvironment[lVar9] != (char *)0x0) goto LAB_00311d01;
          BVar8 = 1;
          name = (char *)0x0;
          ppcVar5 = palEnvironment;
          goto LAB_00311c83;
        }
        iVar6 = iVar6 + 1;
        lVar9 = (long)iVar6;
        __s = ppcVar5[lVar9];
      } while (__s != (char *)0x0);
    }
    BVar8 = 0;
LAB_00311c83:
    szSize = (long)(iVar6 + 2) << 3;
    if (MiscPutenv::sAllocatedEnviron == '\x01') {
      ppcVar5 = (char **)CorUnix::InternalRealloc(ppcVar5,szSize);
      if (ppcVar5 != (char **)0x0) {
LAB_00311ce0:
        palEnvironment = ppcVar5;
        _environ = ppcVar5;
        ppcVar5[lVar9] = name;
        palEnvironment[iVar6 + 1] = (char *)0x0;
LAB_00311d01:
        CorUnix::InternalLeaveCriticalSection(pThread,&gcsEnvironment);
        return 1;
      }
    }
    else {
      ppcVar5 = (char **)CorUnix::InternalMalloc(szSize);
      if (ppcVar5 != (char **)0x0) {
        pcVar2 = *palEnvironment;
        if (pcVar2 != (char *)0x0) {
          iVar1 = 1;
          lVar7 = 0;
          do {
            ppcVar5[lVar7] = pcVar2;
            lVar7 = (long)iVar1;
            pcVar2 = palEnvironment[lVar7];
            iVar1 = iVar1 + 1;
          } while (pcVar2 != (char *)0x0);
        }
        MiscPutenv::sAllocatedEnviron = '\x01';
        goto LAB_00311ce0;
      }
    }
    CorUnix::InternalLeaveCriticalSection(pThread,&gcsEnvironment);
    if (name == (char *)0x0) {
      return BVar8;
    }
  }
  else {
    sVar3 = strlen(string);
    name = (char *)CorUnix::InternalMalloc((long)(int)sVar3);
    if (name == (char *)0x0) {
      return 0;
    }
    sVar3 = (long)((sVar3 << 0x20) + -0x100000000) >> 0x20;
    memcpy(name,string,sVar3);
    name[sVar3] = '\0';
    MiscUnsetenv(name);
    BVar8 = 1;
  }
  CorUnix::InternalFree(name);
  return BVar8;
}

Assistant:

BOOL MiscPutenv(const char *string, BOOL deleteIfEmpty)
{
    const char *equals, *existingEquals;
    char *copy = NULL;
    int length;
    int i, j;
    bool fOwningCS = false;
    BOOL result = FALSE;
    CPalThread * pthrCurrent = InternalGetCurrentThread();

    equals = strchr(string, '=');
    if (equals == string || equals == NULL)
    {
        // "=foo" and "foo" have no meaning
        goto done;
    }
    if (equals[1] == '\0' && deleteIfEmpty)
    {
        // "foo=" removes foo from the environment in _putenv() on Windows.
        // The same string can result from a call to SetEnvironmentVariable()
        // with the empty string as the value, but in that case we want to
        // set the variable's value to "". deleteIfEmpty will be FALSE in
        // that case.
        length = strlen(string);
        copy = (char *) InternalMalloc(length);
        if (copy == NULL)
        {
            goto done;
        }
        memcpy(copy, string, length - 1);
        copy[length - 1] = '\0';    // Change '=' to '\0'
        MiscUnsetenv(copy);
        result = TRUE;
    }
    else
    {
        // See if we are replacing an item or adding one.

        // Make our copy up front, since we'll use it either way.
        copy = InternalStrdup(string);
        if (copy == NULL)
        {
            goto done;
        }

        length = equals - string;

        InternalEnterCriticalSection(pthrCurrent, &gcsEnvironment);
        fOwningCS = true;

        for(i = 0; palEnvironment[i] != NULL; i++)
        {
            existingEquals = strchr(palEnvironment[i], '=');
            if (existingEquals == NULL)
            {
                // The PAL screens out malformed strings, but
                // environ comes from the system, so it might
                // have strings without '='. We treat the entire
                // string as a name in that case.
                existingEquals = palEnvironment[i] + strlen(palEnvironment[i]);
            }
            if (existingEquals - palEnvironment[i] == length)
            {
                if (memcmp(string, palEnvironment[i], length) == 0)
                {
                    // Replace this one. Don't free the original,
                    // though, because there may be outstanding
                    // references to it that were acquired via
                    // getenv. This is an unavoidable memory leak.
                    palEnvironment[i] = copy;

                    // Set 'copy' to NULL so it won't be freed
                    copy = NULL;

                    result = TRUE;
                    break;
                }
            }
        }
        if (palEnvironment[i] == NULL)
        {
            static BOOL sAllocatedEnviron = FALSE;
            // Add a new environment variable.
            // We'd like to realloc palEnvironment, but we can't do that the
            // first time through.
            char **newEnviron = NULL;

            if (sAllocatedEnviron) {
                if (NULL == (newEnviron =
                        (char **)InternalRealloc(palEnvironment, (i + 2) * sizeof(char *))))
                {
                    goto done;
                }
            }
            else
            {
                // Allocate palEnvironment ourselves so we can realloc it later.
                newEnviron = (char **)InternalMalloc((i + 2) * sizeof(char *));
                if (newEnviron == NULL)
                {
                    goto done;
                }
                for(j = 0; palEnvironment[j] != NULL; j++)
                {
                    newEnviron[j] = palEnvironment[j];
                }
                sAllocatedEnviron = TRUE;
            }
            palEnvironment = newEnviron;
            MiscSetEnvArray();
            palEnvironment[i] = copy;
            palEnvironment[i + 1] = NULL;

            // Set 'copy' to NULL so it won't be freed
            copy = NULL;

            result = TRUE;
        }
    }
done:

    if (fOwningCS)
    {
        InternalLeaveCriticalSection(pthrCurrent, &gcsEnvironment);
    }
    if (NULL != copy)
    {
        InternalFree(copy);
    }
    return result;
}